

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O2

void __thiscall bitfoot::Bitfoot::GenerateMoves<false>(Bitfoot *this)

{
  ulong uVar1;
  
  InitMovegen(this,AllMoves);
  if (this->moveStage == 1) {
    if (this->moveCount != 0) {
      __assert_fail("moveCount == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0xe80,"void bitfoot::Bitfoot::GenerateMoves() [color = false]");
    }
    if (this->moveIndex != 0) {
      __assert_fail("moveIndex == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0xe81,"void bitfoot::Bitfoot::GenerateMoves() [color = false]");
    }
    if (this->sortIndex != 0) {
      __assert_fail("sortIndex == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0xe82,"void bitfoot::Bitfoot::GenerateMoves() [color = false]");
    }
    uVar1 = this->chkrs;
    if (uVar1 == 0) {
      GetPromosAndCaptures<false,true>(this);
      GetQuietMoves<false>(this);
    }
    else if ((uVar1 & uVar1 - 1) == 0) {
      GetCheckEvasions<false>(this);
    }
    else {
      AddKingMoves<false>(this,0xffffffffffffffff);
    }
    this->moveStage = 3;
  }
  else if (this->moveStage != 3) {
    __assert_fail("moveStage == PromosAndCaptures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xe7f,"void bitfoot::Bitfoot::GenerateMoves() [color = false]");
  }
  this->moveIndex = 0;
  this->sortIndex = 0;
  return;
}

Assistant:

inline void GenerateMoves() {
    InitMovegen(AllMoves);
    if (moveStage != Finished) {
      assert(moveStage == PromosAndCaptures);
      assert(moveCount == 0);
      assert(moveIndex == 0);
      assert(sortIndex == 0);
      if (chkrs) {
        if (MULTI_BIT(chkrs)) {
          AddKingMoves<color>(_ALL);
        }
        else {
          GetCheckEvasions<color>();
        }
      }
      else {
        GetPromosAndCaptures<color, true>(); // under_promote=true
        GetQuietMoves<color>();
      }
      moveStage = Finished;
    }
    moveIndex = sortIndex = 0;
  }